

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O1

ExprModule * AnalyzeModule(ExpressionContext *ctx,SynModule *syntax)

{
  CompilerStatistics *this;
  Allocator *pAVar1;
  TypeBase *pTVar2;
  ScopeData *pSVar3;
  ExprBase **ppEVar4;
  ExprBase **ppEVar5;
  FunctionData *pFVar6;
  VariableData *pVVar7;
  InplaceStr name;
  undefined1 auVar8 [8];
  uint uVar9;
  int iVar10;
  ByteCode *bytecode;
  Lexeme *lexStream;
  ExprBase *pEVar11;
  undefined4 extraout_var;
  char *pcVar13;
  SynBase *pSVar14;
  undefined4 extraout_var_00;
  _func_int **pp_Var15;
  ulong uVar16;
  ulong uVar17;
  TypeClass *pTVar18;
  SynModuleImport *syntax_00;
  IntrusiveList<ExprBase> *this_00;
  IntrusiveList<ExprBase> expressions;
  TraceScope traceScope_3;
  TraceScope traceScope;
  uint lexStreamSize;
  SmallArray<TypeClass_*,_32U> classTypes;
  IntrusiveList<ExprBase> local_2a8;
  TraceScope local_298;
  char *local_288;
  char *pcStack_280;
  TraceScope local_278;
  undefined1 local_268 [8];
  undefined8 uStack_260;
  ExprBase local_258 [5];
  Allocator *local_158;
  SmallArray<TypeClass_*,_32U> local_148;
  ExprModule *pEVar12;
  undefined4 extraout_var_01;
  
  if (AnalyzeModule(ExpressionContext&,SynModule*)::token == '\0') {
    iVar10 = __cxa_guard_acquire(&AnalyzeModule(ExpressionContext&,SynModule*)::token);
    if (iVar10 != 0) {
      AnalyzeModule::token = NULLC::TraceGetToken("analyze","AnalyzeModule");
      __cxa_guard_release(&AnalyzeModule(ExpressionContext&,SynModule*)::token);
    }
  }
  NULLC::TraceScope::TraceScope(&local_278,AnalyzeModule::token);
  uVar9 = NULLCTime::clockMicro();
  (ctx->statistics).startTime = uVar9;
  (ctx->statistics).finishTime = 0;
  bytecode = (ByteCode *)BinaryCache::GetBytecode("$base$.nc");
  if (bytecode != (ByteCode *)0x0) {
    local_268 = (undefined1  [8])((ulong)local_268 & 0xffffffff00000000);
    lexStream = BinaryCache::GetLexems("$base$.nc",(uint *)local_268);
    local_288 = "$base$.nc";
    pcStack_280 = "";
    name.end = "";
    name.begin = "$base$.nc";
    ImportModule(ctx,&syntax->super_SynBase,bytecode,lexStream,local_268._0_4_,name);
    ctx->baseModuleFunctionCount = (ctx->functions).count;
  }
  syntax_00 = (syntax->imports).head;
  while (syntax_00 != (SynModuleImport *)0x0) {
    AnalyzeModuleImport(ctx,syntax_00);
    syntax_00 = (SynModuleImport *)(syntax_00->super_SynBase).next;
    if ((syntax_00 == (SynModuleImport *)0x0) || ((syntax_00->super_SynBase).typeID != 0x42)) {
      syntax_00 = (SynModuleImport *)0x0;
    }
  }
  AnalyzeImplicitModuleImports(ctx);
  uVar9 = NULLCTime::clockMicro();
  this = &ctx->statistics;
  CompilerStatistics::Finish(this,"Import",uVar9);
  uVar9 = NULLCTime::clockMicro();
  (ctx->statistics).startTime = uVar9;
  (ctx->statistics).finishTime = 0;
  local_2a8.head = (ExprBase *)0x0;
  local_2a8.tail = (ExprBase *)0x0;
  pSVar14 = (syntax->expressions).head;
  if (pSVar14 != (SynBase *)0x0) {
    do {
      pEVar11 = AnalyzeStatement(ctx,pSVar14);
      IntrusiveList<ExprBase>::push_back(&local_2a8,pEVar11);
      pSVar14 = pSVar14->next;
    } while (pSVar14 != (SynBase *)0x0);
  }
  uVar9 = NULLCTime::clockMicro();
  CompilerStatistics::Finish(this,"Expressions",uVar9);
  uVar9 = NULLCTime::clockMicro();
  (ctx->statistics).startTime = uVar9;
  (ctx->statistics).finishTime = 0;
  ClosePendingUpvalues(ctx,(FunctionData *)0x0);
  if (ctx->errorCount == 0) {
    CreateDefaultArgumentFunctionWrappers(ctx);
  }
  iVar10 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x170);
  pEVar12 = (ExprModule *)CONCAT44(extraout_var,iVar10);
  pAVar1 = ctx->allocator;
  pTVar2 = ctx->typeVoid;
  pSVar3 = ctx->globalScope;
  local_268 = (undefined1  [8])local_2a8.head;
  auVar8 = local_268;
  uStack_260 = local_2a8.tail;
  pEVar11 = uStack_260;
  (pEVar12->super_ExprBase).typeID = 0x38;
  (pEVar12->super_ExprBase).source = &syntax->super_SynBase;
  (pEVar12->super_ExprBase).type = pTVar2;
  (pEVar12->super_ExprBase).next = (ExprBase *)0x0;
  (pEVar12->super_ExprBase).listed = false;
  (pEVar12->super_ExprBase)._vptr_ExprBase = (_func_int **)&PTR__ExprModule_00249458;
  pEVar12->moduleScope = pSVar3;
  (pEVar12->definitions).allocator = pAVar1;
  (pEVar12->definitions).data = (pEVar12->definitions).little;
  (pEVar12->definitions).count = 0;
  (pEVar12->definitions).max = 0x20;
  (pEVar12->setup).head = (ExprBase *)0x0;
  (pEVar12->setup).tail = (ExprBase *)0x0;
  local_268._0_4_ = SUB84(local_2a8.head,0);
  local_268._4_4_ = (undefined4)((ulong)local_2a8.head >> 0x20);
  uStack_260._0_4_ = (uint)local_2a8.tail;
  uStack_260._4_4_ = (uint)((ulong)local_2a8.tail >> 0x20);
  *(undefined4 *)&(pEVar12->expressions).head = local_268._0_4_;
  *(undefined4 *)((long)&(pEVar12->expressions).head + 4) = local_268._4_4_;
  *(uint *)&(pEVar12->expressions).tail = (uint)uStack_260;
  *(uint *)((long)&(pEVar12->expressions).tail + 4) = uStack_260._4_4_;
  local_268 = auVar8;
  uStack_260 = pEVar11;
  if (AnalyzeModule(ExpressionContext&,SynModule*)::token == '\0') {
    iVar10 = __cxa_guard_acquire(&AnalyzeModule(ExpressionContext&,SynModule*)::token);
    if (iVar10 != 0) {
      AnalyzeModule(ExpressionContext&,SynModule*)::token =
           NULLC::TraceGetToken("analyze","definitions");
      __cxa_guard_release(&AnalyzeModule(ExpressionContext&,SynModule*)::token);
    }
  }
  NULLC::TraceScope::TraceScope
            ((TraceScope *)local_268,AnalyzeModule(ExpressionContext&,SynModule*)::token);
  if ((ctx->definitions).count != 0) {
    uVar17 = 0;
    do {
      ppEVar4 = (ctx->definitions).data;
      uVar9 = (pEVar12->definitions).count;
      if (uVar9 == (pEVar12->definitions).max) {
        SmallArray<ExprBase_*,_32U>::grow(&pEVar12->definitions,uVar9);
      }
      ppEVar5 = (pEVar12->definitions).data;
      if (ppEVar5 == (ExprBase **)0x0) {
        pcVar13 = "void SmallArray<ExprBase *, 32>::push_back(const T &) [T = ExprBase *, N = 32]";
        goto LAB_0018ce51;
      }
      pEVar11 = ppEVar4[uVar17];
      uVar9 = (pEVar12->definitions).count;
      (pEVar12->definitions).count = uVar9 + 1;
      ppEVar5[uVar9] = pEVar11;
      uVar17 = uVar17 + 1;
    } while (uVar17 < (ctx->definitions).count);
  }
  NULLC::TraceScope::~TraceScope((TraceScope *)local_268);
  if (AnalyzeModule(ExpressionContext&,SynModule*)::token == '\0') {
    iVar10 = __cxa_guard_acquire(&AnalyzeModule(ExpressionContext&,SynModule*)::token);
    if (iVar10 != 0) {
      AnalyzeModule(ExpressionContext&,SynModule*)::token = NULLC::TraceGetToken("analyze","setup");
      __cxa_guard_release(&AnalyzeModule(ExpressionContext&,SynModule*)::token);
    }
  }
  NULLC::TraceScope::TraceScope
            ((TraceScope *)local_268,AnalyzeModule(ExpressionContext&,SynModule*)::token);
  this_00 = &pEVar12->setup;
  if ((ctx->setup).count != 0) {
    uVar17 = 0;
    do {
      IntrusiveList<ExprBase>::push_back(this_00,(ctx->setup).data[uVar17]);
      uVar17 = uVar17 + 1;
    } while (uVar17 < (ctx->setup).count);
  }
  NULLC::TraceScope::~TraceScope((TraceScope *)local_268);
  if (AnalyzeModule(ExpressionContext&,SynModule*)::token == '\0') {
    iVar10 = __cxa_guard_acquire(&AnalyzeModule(ExpressionContext&,SynModule*)::token);
    if (iVar10 != 0) {
      AnalyzeModule(ExpressionContext&,SynModule*)::token =
           NULLC::TraceGetToken("analyze","vtables");
      __cxa_guard_release(&AnalyzeModule(ExpressionContext&,SynModule*)::token);
    }
  }
  NULLC::TraceScope::TraceScope(&local_298,AnalyzeModule(ExpressionContext&,SynModule*)::token);
  local_158 = ctx->allocator;
  local_268 = (undefined1  [8])local_258;
  uStack_260 = (ExprBase *)0x2000000000;
  local_148.data = local_148.little;
  local_148.count = 0;
  local_148.max = 0x20;
  local_148.allocator = local_158;
  if ((ctx->functions).count != 0) {
    uVar17 = 0;
    do {
      pFVar6 = (ctx->functions).data[uVar17];
      pTVar2 = pFVar6->scope->ownerType;
      if ((pTVar2 != (TypeBase *)0x0) && (pTVar2->isGeneric == false)) {
        pcVar13 = strstr((pFVar6->name->name).begin,"::");
        if (pcVar13 != (char *)0x0) {
          if ((uint)uStack_260 == uStack_260._4_4_) {
            SmallArray<FunctionData_*,_32U>::grow
                      ((SmallArray<FunctionData_*,_32U> *)local_268,(uint)uStack_260);
          }
          if (local_268 == (undefined1  [8])0x0) {
            pcVar13 = 
            "void SmallArray<FunctionData *, 32>::push_back(const T &) [T = FunctionData *, N = 32]"
            ;
            goto LAB_0018ce51;
          }
          uVar16 = (ulong)uStack_260 & 0xffffffff;
          uStack_260 = (ExprBase *)CONCAT44(uStack_260._4_4_,(uint)uStack_260 + 1);
          ((_func_int ***)local_268)[uVar16] = (_func_int **)pFVar6;
        }
      }
      uVar17 = uVar17 + 1;
    } while (uVar17 < (ctx->functions).count);
  }
  if ((ctx->types).count != 0) {
    uVar17 = 0;
    do {
      pTVar18 = (TypeClass *)(ctx->types).data[uVar17];
      if ((pTVar18 == (TypeClass *)0x0) ||
         ((pTVar18->super_TypeStruct).super_TypeBase.typeID != 0x18)) {
        pTVar18 = (TypeClass *)0x0;
      }
      if (pTVar18 != (TypeClass *)0x0) {
        if (local_148.count == local_148.max) {
          SmallArray<TypeClass_*,_32U>::grow(&local_148,local_148.count);
        }
        if (local_148.data == (TypeClass **)0x0) {
          pcVar13 = 
          "void SmallArray<TypeClass *, 32>::push_back(const T &) [T = TypeClass *, N = 32]";
LAB_0018ce51:
          __assert_fail("data",
                        "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                        ,0x162,pcVar13);
        }
        uVar16 = local_148._8_8_ & 0xffffffff;
        local_148.count = local_148.count + 1;
        local_148.data[uVar16] = pTVar18;
      }
      uVar17 = uVar17 + 1;
    } while (uVar17 < (ctx->types).count);
  }
  if ((ctx->vtables).count != 0) {
    uVar17 = 0;
    do {
      pSVar14 = &ExpressionContext::MakeInternal(ctx,&syntax->super_SynBase)->super_SynBase;
      if ((ctx->vtables).count <= uVar17) goto LAB_0018cdef;
      pEVar11 = CreateVirtualTableUpdate
                          (ctx,pSVar14,(ctx->vtables).data[uVar17],
                           (SmallArray<FunctionData_*,_32U> *)local_268,&local_148);
      IntrusiveList<ExprBase>::push_back(this_00,pEVar11);
      uVar17 = uVar17 + 1;
    } while (uVar17 < (ctx->vtables).count);
  }
  SmallArray<TypeClass_*,_32U>::~SmallArray(&local_148);
  SmallArray<FunctionData_*,_32U>::~SmallArray((SmallArray<FunctionData_*,_32U> *)local_268);
  NULLC::TraceScope::~TraceScope(&local_298);
  if (AnalyzeModule(ExpressionContext&,SynModule*)::token == '\0') {
    iVar10 = __cxa_guard_acquire(&AnalyzeModule(ExpressionContext&,SynModule*)::token);
    if (iVar10 != 0) {
      AnalyzeModule(ExpressionContext&,SynModule*)::token =
           NULLC::TraceGetToken("analyze","upvalues");
      __cxa_guard_release(&AnalyzeModule(ExpressionContext&,SynModule*)::token);
    }
  }
  NULLC::TraceScope::TraceScope
            ((TraceScope *)local_268,AnalyzeModule(ExpressionContext&,SynModule*)::token);
  if ((ctx->upvalues).count != 0) {
    uVar17 = 0;
    do {
      iVar10 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x40);
      pEVar11 = (ExprBase *)CONCAT44(extraout_var_00,iVar10);
      pSVar14 = &ExpressionContext::MakeInternal(ctx,&syntax->super_SynBase)->super_SynBase;
      pTVar2 = ctx->typeVoid;
      iVar10 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x20);
      pp_Var15 = (_func_int **)CONCAT44(extraout_var_01,iVar10);
      if ((ctx->upvalues).count <= uVar17) {
LAB_0018cdef:
        __assert_fail("index < count",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                      ,0x199,
                      "T &SmallArray<VariableData *, 128>::operator[](unsigned int) [T = VariableData *, N = 128]"
                     );
      }
      pVVar7 = (ctx->upvalues).data[uVar17];
      *pp_Var15 = (_func_int *)0x0;
      pp_Var15[1] = (_func_int *)pVVar7;
      pp_Var15[2] = (_func_int *)0x0;
      *(undefined1 *)(pp_Var15 + 3) = 0;
      pEVar11->typeID = 0x1e;
      pEVar11->source = pSVar14;
      pEVar11->type = pTVar2;
      pEVar11->next = (ExprBase *)0x0;
      pEVar11->listed = false;
      pEVar11->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_00248a48;
      pEVar11[1]._vptr_ExprBase = pp_Var15;
      *(undefined8 *)&pEVar11[1].typeID = 0;
      IntrusiveList<ExprBase>::push_back(this_00,pEVar11);
      uVar17 = uVar17 + 1;
    } while (uVar17 < (ctx->upvalues).count);
  }
  NULLC::TraceScope::~TraceScope((TraceScope *)local_268);
  uVar9 = NULLCTime::clockMicro();
  CompilerStatistics::Finish(this,"Finalization",uVar9);
  NULLC::TraceScope::~TraceScope(&local_278);
  return pEVar12;
}

Assistant:

ExprModule* AnalyzeModule(ExpressionContext &ctx, SynModule *syntax)
{
	TRACE_SCOPE("analyze", "AnalyzeModule");

	ctx.statistics.Start(NULLCTime::clockMicro());

	// Import base module
	if(const char *bytecode = BinaryCache::GetBytecode("$base$.nc"))
	{
		unsigned lexStreamSize = 0;
		Lexeme *lexStream = BinaryCache::GetLexems("$base$.nc", lexStreamSize);

		if(bytecode)
			ImportModule(ctx, syntax, (ByteCode*)bytecode, lexStream, lexStreamSize, InplaceStr("$base$.nc"));
		else
			Stop(ctx, syntax, "ERROR: base module couldn't be imported");

		ctx.baseModuleFunctionCount = ctx.functions.size();
	}

	for(SynModuleImport *import = syntax->imports.head; import; import = getType<SynModuleImport>(import->next))
		AnalyzeModuleImport(ctx, import);

	AnalyzeImplicitModuleImports(ctx);

	ctx.statistics.Finish("Import", NULLCTime::clockMicro());

	ctx.statistics.Start(NULLCTime::clockMicro());

	IntrusiveList<ExprBase> expressions;

	for(SynBase *expr = syntax->expressions.head; expr; expr = expr->next)
		expressions.push_back(AnalyzeStatement(ctx, expr));

	ctx.statistics.Finish("Expressions", NULLCTime::clockMicro());

	ctx.statistics.Start(NULLCTime::clockMicro());

	ClosePendingUpvalues(ctx, NULL);

	// Don't create wrappers in ill-formed module
	if(ctx.errorCount == 0)
		CreateDefaultArgumentFunctionWrappers(ctx);

	ExprModule *module = new (ctx.get<ExprModule>()) ExprModule(ctx.allocator, syntax, ctx.typeVoid, ctx.globalScope, expressions);

	{
		TRACE_SCOPE("analyze", "definitions");

		for(unsigned i = 0; i < ctx.definitions.size(); i++)
			module->definitions.push_back(ctx.definitions[i]);
	}

	{
		TRACE_SCOPE("analyze", "setup");

		for(unsigned i = 0; i < ctx.setup.size(); i++)
			module->setup.push_back(ctx.setup[i]);
	}

	{
		TRACE_SCOPE("analyze", "vtables");

		SmallArray<FunctionData*, 32> possibleFunctions(ctx.allocator);
		SmallArray<TypeClass*, 32> classTypes(ctx.allocator);

		for(unsigned i = 0; i < ctx.functions.size(); i++)
		{
			FunctionData *function = ctx.functions[i];

			TypeBase *parentType = function->scope->ownerType;

			if(!parentType)
				continue;

			if(parentType->isGeneric)
				continue;

			const char *pos = strstr(function->name->name.begin, "::");

			if(!pos)
				continue;

			possibleFunctions.push_back(function);
		}

		for(unsigned i = 0; i < ctx.types.size(); i++)
		{
			TypeBase *type = ctx.types[i];

			if(TypeClass *classType = getType<TypeClass>(type))
				classTypes.push_back(classType);
		}

		for(unsigned i = 0; i < ctx.vtables.size(); i++)
			module->setup.push_back(CreateVirtualTableUpdate(ctx, ctx.MakeInternal(syntax), ctx.vtables[i], possibleFunctions, classTypes));
	}

	{
		TRACE_SCOPE("analyze", "upvalues");

		for(unsigned i = 0; i < ctx.upvalues.size(); i++)
			module->setup.push_back(new (ctx.get<ExprVariableDefinition>()) ExprVariableDefinition(ctx.MakeInternal(syntax), ctx.typeVoid, new (ctx.get<VariableHandle>()) VariableHandle(NULL, ctx.upvalues[i]), NULL));
	}

	ctx.statistics.Finish("Finalization", NULLCTime::clockMicro());

	return module;
}